

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVodeSStolerances(void *cvode_mem,sunrealtype reltol,sunrealtype abstol)

{
  double dVar1;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  CVodeMem cv_mem;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x29b,"CVodeSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,0x2a2,"CVodeSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (0.0 <= dVar1) {
      in_RDI->cv_reltol = in_XMM0_Qa;
      in_RDI->cv_Sabstol = dVar1;
      in_RDI->cv_atolmin0 = (uint)(dVar1 == 0.0);
      in_RDI->cv_itol = 1;
      in_RDI->cv_user_efun = 0;
      in_RDI->cv_efun = cvEwtSet;
      in_RDI->cv_e_data = (void *)0x0;
      local_4 = 0;
    }
    else {
      cvProcessError(in_RDI,-0x16,0x2b2,"CVodeSStolerances",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                     ,"abstol has negative component(s) (illegal).");
      local_4 = -0x16;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x2ab,"CVodeSStolerances",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,"reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSStolerances(void* cvode_mem, sunrealtype reltol, sunrealtype abstol)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_MALLOC, __LINE__, __func__, __FILE__,
                   MSGCV_NO_MALLOC);
    return (CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_RELTOL);
    return (CV_ILL_INPUT);
  }

  if (abstol < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ABSTOL);
    return (CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  cv_mem->cv_reltol   = reltol;
  cv_mem->cv_Sabstol  = abstol;
  cv_mem->cv_atolmin0 = (abstol == ZERO);

  cv_mem->cv_itol = CV_SS;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun      = cvEwtSet;
  cv_mem->cv_e_data    = NULL; /* will be set to cvode_mem in InitialSetup */

  return (CV_SUCCESS);
}